

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

UChar __thiscall
icu_63::FCDUTF8CollationIterator::handleGetTrailSurrogate(FCDUTF8CollationIterator *this)

{
  int32_t *piVar1;
  char16_t cVar2;
  
  if (this->state == IN_NORMALIZED) {
    cVar2 = UnicodeString::doCharAt(&this->normalized,(this->super_UTF8CollationIterator).pos);
    if ((cVar2 & 0xfc00U) == 0xdc00) {
      piVar1 = &(this->super_UTF8CollationIterator).pos;
      *piVar1 = *piVar1 + 1;
    }
    return cVar2;
  }
  return L'\0';
}

Assistant:

UChar
FCDUTF8CollationIterator::handleGetTrailSurrogate() {
    if(state != IN_NORMALIZED) { return 0; }
    U_ASSERT(pos < normalized.length());
    UChar trail;
    if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
    return trail;
}